

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_nb_type(connectdata *conn,_Bool ascii,ftpstate newstate)

{
  CURLcode CVar1;
  byte bVar2;
  
  bVar2 = !ascii << 3 | 0x41;
  if ((conn->proto).ftpc.transfertype == bVar2) {
    (conn->proto).ftpc.state = newstate;
    CVar1 = ftp_state_type_resp(conn,200,newstate);
    return CVar1;
  }
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"TYPE %c",(ulong)bVar2);
  if (CVar1 == CURLE_OK) {
    (conn->proto).ftpc.state = newstate;
    (conn->proto).ftpc.transfertype = bVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode ftp_nb_type(struct connectdata *conn,
                            bool ascii, ftpstate newstate)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  char want = (char)(ascii?'A':'I');

  if(ftpc->transfertype == want) {
    state(conn, newstate);
    return ftp_state_type_resp(conn, 200, newstate);
  }

  PPSENDF(&ftpc->pp, "TYPE %c", want);
  state(conn, newstate);

  /* keep track of our current transfer type */
  ftpc->transfertype = want;
  return CURLE_OK;
}